

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

string * __thiscall
t_dart_generator::render_const_value
          (string *__return_storage_ptr__,t_dart_generator *this,ostream *out,string name,
          t_type *type,t_const_value *value)

{
  uint uVar1;
  int iVar2;
  t_const_value_type tVar3;
  t_type *type_00;
  ostream *poVar4;
  int64_t iVar5;
  char *pcVar6;
  t_const_value *in_R9;
  undefined1 auVar7 [12];
  ostringstream render;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  type_00 = t_type::get_true_type((t_type *)value);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar2 = (*(type_00->super_t_doc)._vptr_t_doc[5])(type_00);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(type_00->super_t_doc)._vptr_t_doc[10])(type_00);
    if ((char)iVar2 != '\0') {
      t_const_value::get_integer(in_R9);
      std::ostream::_M_insert<long>((long)local_1a8);
      goto LAB_001b69fa;
    }
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"tmp","");
    t_generator::tmp(&local_208,(t_generator *)this,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_208._M_dataplus._M_p,
               local_208._M_dataplus._M_p + local_208._M_string_length);
    print_const_value(this,out,&local_1e8,type_00,in_R9,true,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
LAB_001b6993:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  else {
    uVar1 = *(uint *)&type_00[1].super_t_doc._vptr_t_doc;
    switch(uVar1) {
    case 1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
      t_generator::get_escaped_string_abi_cxx11_(&local_208,(t_generator *)this,in_R9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
      goto LAB_001b6993;
    case 2:
      iVar5 = t_const_value::get_integer(in_R9);
      pcVar6 = "false";
      if (0 < iVar5) {
        pcVar6 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar6,(ulong)(0 < iVar5) ^ 5);
      break;
    case 7:
      tVar3 = t_const_value::get_type(in_R9);
      if (tVar3 != CV_INTEGER) {
        std::ostream::_M_insert<double>(in_R9->doubleVal_);
        break;
      }
    case 3:
    case 4:
    case 5:
    case 6:
      t_const_value::get_integer(in_R9);
      std::ostream::_M_insert<long>((long)local_1a8);
      break;
    default:
      auVar7 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_208,(t_base_type *)(ulong)uVar1,auVar7._8_4_);
      std::operator+(auVar7._0_8_,"compiler error: no const of base type ",&local_208);
      __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
LAB_001b69fa:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::render_const_value(ostream& out,
                                           string name,
                                           t_type* type,
                                           t_const_value* value) {
  (void)name;
  type = get_true_type(type);
  std::ostringstream render;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      render << "'" << get_escaped_string(value) << "'";
      break;
    case t_base_type::TYPE_BOOL:
      render << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      render << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        render << value->get_integer();
      } else {
        render << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    render << value->get_integer();
  } else {
    string t = tmp("tmp");
    print_const_value(out, t, type, value, true);
    out << endl;
    render << t;
  }

  return render.str();
}